

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::configureLayeredFramebufferAttachment
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,GLuint texture_id,
          bool should_use_as_color_attachment)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GLenum attachment;
  bool should_use_as_color_attachment_local;
  GLuint texture_id_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (should_use_as_color_attachment) {
    gl._4_4_ = 0x8ce0;
  }
  else {
    gl._4_4_ = 0x8d00;
  }
  (**(code **)(lVar4 + 0x78))(0x8ca9,this->m_framebuffer_object_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0xef);
  (**(code **)(lVar4 + 0x690))(0x8ca9,gl._4_4_,texture_id,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glFramebufferTextureEXT() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0xf3);
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::configureLayeredFramebufferAttachment(
	glw::GLuint texture_id, bool should_use_as_color_attachment)
{
	glw::GLenum			  attachment = GL_NONE;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	/* Determine which attachment should be used */
	if (true == should_use_as_color_attachment)
	{
		attachment = GL_COLOR_ATTACHMENT0;
	}
	else
	{
		attachment = GL_DEPTH_ATTACHMENT;
	}

	/* Re-bind the draw framebuffer, just in case. */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	/* Update the FBO's attachment  */
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, attachment, texture_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureEXT() call failed.");
}